

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateDSTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_0::StencilParamsBasicTestInstance::iterate
          (TestStatus *__return_storage_ptr__,StencilParamsBasicTestInstance *this)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer_s *pVVar2;
  VkOffset3D offset;
  bool bVar3;
  VkResult result;
  int iVar4;
  int iVar5;
  TestContext *this_00;
  TestLog *log_00;
  VkQueue queue_00;
  Buffer *this_01;
  VkCommandBuffer_s **ppVVar6;
  Handle<(vk::HandleType)18> *pHVar7;
  PixelBufferAccess *this_02;
  Image *this_03;
  Allocator *allocator;
  ConstPixelBufferAccess *reference;
  Move<vk::VkCommandBuffer_s_*> *this_04;
  float fVar8;
  float fVar9;
  allocator<char> local_1a9;
  string local_1a8;
  undefined4 local_188;
  allocator<char> local_181;
  string local_180;
  void *local_160;
  undefined4 local_158;
  undefined1 local_150 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  float xCoord;
  int x;
  float yCoord;
  int y;
  deInt32 frameHeight;
  deInt32 frameWidth;
  TextureFormat local_f8;
  undefined1 local_f0 [8];
  Texture2D referenceFrame;
  undefined8 uStack_98;
  VkSubmitInfo submitInfo;
  deUint64 local_38;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkQueue queue;
  TestLog *log;
  StencilParamsBasicTestInstance *this_local;
  
  this_00 = Context::getTestContext((this->super_DepthStencilBaseCase).super_TestInstance.m_context)
  ;
  log_00 = tcu::TestContext::getLog(this_00);
  queue_00 = Context::getUniversalQueue
                       ((this->super_DepthStencilBaseCase).super_TestInstance.m_context);
  DepthStencilBaseCase::beginRenderPass(&this->super_DepthStencilBaseCase);
  DepthStencilBaseCase::setDynamicViewportState(&this->super_DepthStencilBaseCase,0x80,0x80);
  DepthStencilBaseCase::setDynamicRasterizationState
            (&this->super_DepthStencilBaseCase,1.0,0.0,0.0,0.0);
  DepthStencilBaseCase::setDynamicBlendState(&this->super_DepthStencilBaseCase,0.0,0.0,0.0,0.0);
  vertexBuffer.m_internal = 0;
  this_01 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DepthStencilBaseCase).m_vertexBuffer);
  local_38 = (deUint64)Draw::Buffer::object(this_01);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  this_04 = &(this->super_DepthStencilBaseCase).m_cmdBuffer;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_04->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x58])(pDVar1,*ppVVar6,0,1,&local_38,&vertexBuffer);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_04->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar6;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->super_DepthStencilBaseCase).m_pipeline_1.
                       super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,pVVar2,0,pHVar7->m_internal);
  DepthStencilBaseCase::setDynamicDepthStencilState
            (&this->super_DepthStencilBaseCase,-1.0,1.0,0xff,this->m_writeMask,0xf,0xff,
             this->m_writeMask,0xf);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_04->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,*ppVVar6,4,1,0);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_04->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar6;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->super_DepthStencilBaseCase).m_pipeline_2.
                       super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,pVVar2,0,pHVar7->m_internal);
  DepthStencilBaseCase::setDynamicDepthStencilState
            (&this->super_DepthStencilBaseCase,-1.0,1.0,this->m_readMask,0xff,this->m_expectedValue,
             this->m_readMask,0xff,this->m_expectedValue);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_04->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,*ppVVar6,4,1,4,0);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_04->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x76])(pDVar1,*ppVVar6);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_04->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x4a])(pDVar1,*ppVVar6);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_98 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&this_04->super_RefBase<vk::VkCommandBuffer_s_*>);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle
            ((Handle<(vk::HandleType)6> *)&referenceFrame.m_view.m_levels,0);
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,queue_00,1,&uStack_98);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  result = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,queue_00);
  ::vk::checkResult(result,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/dynamic_state/vktDynamicStateDSTests.cpp"
                    ,0x27a);
  local_f8 = ::vk::mapVkFormat((this->super_DepthStencilBaseCase).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D((Texture2D *)local_f0,&local_f8,0x80,0x80);
  tcu::Texture2D::allocLevel((Texture2D *)local_f0,0);
  iVar4 = tcu::Texture2D::getWidth((Texture2D *)local_f0);
  iVar5 = tcu::Texture2D::getHeight((Texture2D *)local_f0);
  for (x = 0; x < iVar5; x = x + 1) {
    fVar8 = (float)x / ((float)iVar5 * 0.5) - 1.0;
    for (zeroOffset.z = 0; zeroOffset.z < iVar4; zeroOffset.z = zeroOffset.z + 1) {
      fVar9 = (float)zeroOffset.z / ((float)iVar4 * 0.5) - 1.0;
      if ((((-1.0 <= fVar9) && (fVar9 <= 1.0)) && (-1.0 <= fVar8)) && (fVar8 <= 1.0)) {
        this_02 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_f0,0);
        tcu::PixelBufferAccess::setPixel(this_02,&this->m_expectedColor,zeroOffset.z,x,0);
      }
    }
  }
  renderedFrame.m_data = (void *)0x0;
  this_03 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DepthStencilBaseCase).m_colorTargetImage);
  allocator = Context::getDefaultAllocator
                        ((this->super_DepthStencilBaseCase).super_TestInstance.m_context);
  local_158 = 0;
  local_160 = renderedFrame.m_data;
  offset.z = 0;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_150,this_03,queue_00,allocator,VK_IMAGE_LAYOUT_GENERAL,
             offset,0x80,0x80,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  reference = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_f0,0)->
               super_ConstPixelBufferAccess;
  bVar3 = tcu::fuzzyCompare(log_00,"Result","Image comparison result",reference,
                            (ConstPixelBufferAccess *)local_150,0.05,COMPARE_LOG_RESULT);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"Image verification passed",&local_1a9);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"Image verification failed",&local_181);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
  }
  local_188 = 1;
  tcu::Texture2D::~Texture2D((Texture2D *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		tcu::TestLog &log = m_context.getTestContext().getLog();
		const vk::VkQueue queue = m_context.getUniversalQueue();

		beginRenderPass();

		// set states here
		setDynamicViewportState(WIDTH, HEIGHT);
		setDynamicRasterizationState();
		setDynamicBlendState();

		const vk::VkDeviceSize vertexBufferOffset = 0;
		const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();
		m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline_1);
		setDynamicDepthStencilState(-1.0f, 1.0f, 0xFF, m_writeMask, 0x0F, 0xFF, m_writeMask, 0x0F);
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 0, 0);

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline_2);
		setDynamicDepthStencilState(-1.0f, 1.0f, m_readMask, 0xFF, m_expectedValue, m_readMask, 0xFF, m_expectedValue);
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 4, 0);

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// validation
		{
			VK_CHECK(m_vk.queueWaitIdle(queue));

			tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
			referenceFrame.allocLevel(0);

			const deInt32 frameWidth = referenceFrame.getWidth();
			const deInt32 frameHeight = referenceFrame.getHeight();

			for (int y = 0; y < frameHeight; y++)
			{
				const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

				for (int x = 0; x < frameWidth; x++)
				{
					const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

					if (xCoord >= -1.0f && xCoord <= 1.0f && yCoord >= -1.0f && yCoord <= 1.0f)
						referenceFrame.getLevel(0).setPixel(m_expectedColor, x, y);
				}
			}

			const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
			const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
				vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

			if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
				referenceFrame.getLevel(0), renderedFrame, 0.05f,
				tcu::COMPARE_LOG_RESULT))
			{
				return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Image verification failed");
			}

			return tcu::TestStatus(QP_TEST_RESULT_PASS, "Image verification passed");
		}
	}